

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlibemu_opl_inc.c
# Opt level: O0

void change_frequency(OPL_DATA_conflict *chip,Bitu chanbase,Bitu regbase,op_type_conflict *op_pt)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  double dVar4;
  double vol_in;
  sbyte local_28;
  Bit32u note_sel;
  Bit32u oct;
  Bit32u frn;
  op_type_conflict *op_pt_local;
  Bitu regbase_local;
  Bitu chanbase_local;
  OPL_DATA_conflict *chip_local;
  
  uVar1 = (chip->adlibreg[chanbase + 0xb0] & 3) * 0x100 + (uint)chip->adlibreg[chanbase + 0xa0];
  uVar2 = chip->adlibreg[chanbase + 0xb0] >> 2 & 7;
  op_pt->freq_high = uVar1 >> 7 & 7;
  uVar3 = (int)(uint)chip->adlibreg[8] >> 6 & 1;
  op_pt->toff = uVar1 >> 9 & (uVar3 ^ 1) | uVar1 >> 8 & uVar3;
  op_pt->toff = uVar2 * 2 + op_pt->toff;
  if ((chip->adlibreg[regbase + 0x20] & 0x10) == 0) {
    op_pt->toff = op_pt->toff >> 2;
  }
  local_28 = (sbyte)uVar2;
  op_pt->tinc = (Bit32u)(long)((double)(uVar1 << local_28) *
                              chip->frqmul[chip->adlibreg[regbase + 0x20] & 0xf]);
  dVar4 = pow(2.0,(kslmul[(int)(uint)chip->adlibreg[regbase + 0x40] >> 6] *
                   (double)kslev[uVar2][uVar1 >> 6] +
                  (double)(chip->adlibreg[regbase + 0x40] & 0x3f)) * -0.125 + -14.0);
  op_pt->vol = dVar4;
  change_attackrate(chip,regbase,op_pt);
  change_decayrate(chip,regbase,op_pt);
  change_releaserate(chip,regbase,op_pt);
  return;
}

Assistant:

static void change_frequency(OPL_DATA* chip, Bitu chanbase, Bitu regbase, op_type* op_pt)
{
	Bit32u frn;
	Bit32u oct;
	Bit32u note_sel;
	fltype vol_in;
	
	// frequency
	frn = ((((Bit32u)chip->adlibreg[ARC_KON_BNUM+chanbase])&3)<<8) + (Bit32u)chip->adlibreg[ARC_FREQ_NUM+chanbase];
	// block number/octave
	oct = ((((Bit32u)chip->adlibreg[ARC_KON_BNUM+chanbase])>>2)&7);
	op_pt->freq_high = (Bit32s)((frn>>7)&7);

	// keysplit
	note_sel = (chip->adlibreg[8]>>6)&1;
	op_pt->toff = ((frn>>9)&(note_sel^1)) | ((frn>>8)&note_sel);
	op_pt->toff += (oct<<1);

	// envelope scaling (KSR)
	if (!(chip->adlibreg[ARC_TVS_KSR_MUL+regbase]&0x10)) op_pt->toff >>= 2;

	// 20+a0+b0:
	op_pt->tinc = (Bit32u)((((fltype)(frn<<oct))*chip->frqmul[chip->adlibreg[ARC_TVS_KSR_MUL+regbase]&15]));
	// 40+a0+b0:
	vol_in = (fltype)((fltype)(chip->adlibreg[ARC_KSL_OUTLEV+regbase]&63) +
							kslmul[chip->adlibreg[ARC_KSL_OUTLEV+regbase]>>6]*kslev[oct][frn>>6]);
	op_pt->vol = (fltype)(pow(FL2,(fltype)(vol_in * -0.125 - 14)));

	// operator frequency changed, care about features that depend on it
	change_attackrate(chip, regbase,op_pt);
	change_decayrate(chip, regbase,op_pt);
	change_releaserate(chip, regbase,op_pt);
}